

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O2

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<short,float>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          float *out_value)

{
  bool bVar1;
  DataBuffer *pDVar2;
  ulong uVar3;
  short *psVar4;
  int i;
  ulong uVar5;
  byte bVar6;
  float fVar7;
  
  pDVar2 = this->buffer_;
  psVar4 = (short *)((pDVar2->data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start +
                    this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_);
  bVar1 = this->normalized_;
  uVar3 = 0;
  while( true ) {
    bVar6 = this->num_components_;
    uVar5 = (ulong)bVar6;
    if (out_num_components <= bVar6) {
      bVar6 = out_num_components;
    }
    if (bVar6 <= uVar3) goto LAB_001100a3;
    if ((pDVar2->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish <= psVar4) break;
    fVar7 = (float)(int)*psVar4 / 32767.0;
    if ((bVar1 & 1U) == 0) {
      fVar7 = (float)(int)*psVar4;
    }
    out_value[uVar3] = fVar7;
    psVar4 = psVar4 + 1;
    uVar3 = uVar3 + 1;
  }
LAB_001100a8:
  return bVar6 <= uVar3;
LAB_001100a3:
  for (; uVar5 < out_num_components; uVar5 = uVar5 + 1) {
    out_value[uVar5] = 0.0;
  }
  goto LAB_001100a8;
}

Assistant:

inline int64_t GetBytePos(AttributeValueIndex att_index) const {
    return byte_offset_ + byte_stride_ * att_index.value();
  }